

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int *expected_records,
               int expected_num_records,ion_boolean_t records_exist)

{
  int actual;
  byte bVar1;
  planck_unit_result_t pVar2;
  bool bVar3;
  char cVar4;
  int i;
  Cursor<int,_int> *this;
  ulong uVar5;
  ulong uVar6;
  int actual_00;
  uint local_50;
  
  this = Dictionary<int,_int>::allRecords(dict);
  bVar1 = this->cursor->status - 2;
  if (records_exist == '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar1 & 0xfd) != 0),0xdd,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') goto LAB_00101b0b;
    bVar3 = Cursor<int,_int>::next(this);
    cVar4 = planck_unit_assert_true
                      (tc,(uint)!bVar3,0xde,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
  }
  else {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar1 & 0xfd) == 0),0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') goto LAB_00101b0b;
    bVar3 = Cursor<int,_int>::next(this);
    actual_00 = 0;
    uVar6 = 0;
    if (0 < expected_num_records) {
      uVar6 = (ulong)(uint)expected_num_records;
    }
    local_50 = 0;
    while (bVar3 != false) {
      actual = *(this->record).key;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (expected_records[uVar5] == actual) goto LAB_001019ca;
      }
      uVar5 = (ulong)local_50;
LAB_001019ca:
      local_50 = (uint)uVar5;
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,expected_records[(int)local_50],actual,0xf4,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if ((pVar2 == '\0') ||
         (pVar2 = planck_unit_assert_int_are_equal
                            (tc,expected_records[(int)local_50],*(this->record).value,0xf5,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                            ), pVar2 == '\0')) goto LAB_00101b0b;
      expected_records[(int)local_50] = 999;
      bVar3 = Cursor<int,_int>::next(this);
      actual_00 = actual_00 + 1;
    }
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((this->cursor->status - 2U & 0xfd) != 0),0xfc,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') goto LAB_00101b0b;
    cVar4 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,actual_00,0xff,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
  }
  if (cVar4 != '\0') {
    Cursor<int,_int>::~Cursor(this);
    operator_delete(this);
    return;
  }
LAB_00101b0b:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int expected_records[],
	int expected_num_records,
	ion_boolean_t records_exist
) {
	Cursor<int, int> *cursor = dict->allRecords();

	if (!records_exist) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	int records_found			= 0;
	int curr_pos				= 0;

	ion_cursor_status_t status	= cursor->next();

	while (status) {
		for (int i = 0; i < expected_num_records; i++) {
			if (expected_records[i] == cursor->getKey()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getValue());

		expected_records[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}